

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::makeMetaMessage(MidiMessage *this,int mnum,string *data)

{
  byte local_22;
  value_type_conflict2 local_21;
  string *local_20;
  string *data_local;
  MidiMessage *pMStack_10;
  int mnum_local;
  MidiMessage *this_local;
  
  local_20 = data;
  data_local._4_4_ = mnum;
  pMStack_10 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  local_21 = 0xff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_21);
  local_22 = (byte)data_local._4_4_ & 0x7f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_22);
  setMetaContent(this,local_20);
  return;
}

Assistant:

void MidiMessage::makeMetaMessage(int mnum, const std::string& data) {
	resize(0);
	push_back(0xff);
	push_back(mnum & 0x7f); // max meta-message number is 0x7f.
	setMetaContent(data);
}